

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_scalar.cpp
# Opt level: O1

extent_float_t __thiscall
ear::PolarExtentCoreScalar::weight_stadium
          (PolarExtentCoreScalar *this,PolarExtentCoreContext *ctx,ExtentPosition *position)

{
  float fVar1;
  ExtentPosition EVar2;
  float local_c;
  
  EVar2 = ExtentPosition::transform(position,ctx->flippedBasis);
  if (0.0 <= ctx->circle_test[0] * ABS(EVar2.x) + ctx->circle_test[1] * EVar2.y) {
    fVar1 = ABS(EVar2.z);
    if (fVar1 <= ctx->sin_start_angle) {
      return 1.0;
    }
    if (ctx->sin_end_angle <= fVar1) {
      return 0.0;
    }
    local_c = ctx->m;
    fVar1 = asinf(fVar1);
  }
  else {
    fVar1 = ABS(EVar2.x) * ctx->right_circle_centre[0] + EVar2.y * ctx->right_circle_centre[1];
    if (ctx->cos_start_angle <= fVar1) {
      return 1.0;
    }
    if (fVar1 <= ctx->cos_end_angle) {
      return 0.0;
    }
    local_c = ctx->m;
    fVar1 = acosf(fVar1);
  }
  return fVar1 * local_c + ctx->c;
}

Assistant:

extent_float_t weight_stadium(PolarExtentCoreContext &ctx,
                                  const ExtentPosition &position) const {
      ExtentPosition position_t = position.transform(ctx.flippedBasis);

      ExtentPosition position_t_right = position_t;
      position_t_right.x = std::abs(position_t.x);

      auto circle_test_dot = position_t_right.x * ctx.circle_test[0] +
                             position_t_right.y * ctx.circle_test[1];
      bool in_straight_line_part = circle_test_dot >= 0.0;

      if (in_straight_line_part)
        return weight_from_sin(ctx, std::abs(position_t.z));
      else {
        auto circle_dot = position_t_right.x * ctx.right_circle_centre[0] +
                          position_t_right.y * ctx.right_circle_centre[1];
        return weight_from_cos(ctx, circle_dot);
      }
    }